

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

NonMaximumSuppressionLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_nonmaximumsuppression(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x578) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x578;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
    NonMaximumSuppressionLayerParams::NonMaximumSuppressionLayerParams
              (this_00.nonmaximumsuppression_);
    (this->layer_).nonmaximumsuppression_ = (NonMaximumSuppressionLayerParams *)this_00;
  }
  return (NonMaximumSuppressionLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::NonMaximumSuppressionLayerParams* NeuralNetworkLayer::mutable_nonmaximumsuppression() {
  if (!has_nonmaximumsuppression()) {
    clear_layer();
    set_has_nonmaximumsuppression();
    layer_.nonmaximumsuppression_ = new ::CoreML::Specification::NonMaximumSuppressionLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.NonMaximumSuppression)
  return layer_.nonmaximumsuppression_;
}